

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

void glu::initCoreFunctions(Functions *dst,FunctionLoader *loader,ApiType apiType)

{
  bool bVar1;
  int iVar2;
  InternalError *this;
  string local_a0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  deUint32 local_34;
  int local_30;
  int ndx;
  FunctionLoader *local_20;
  FunctionLoader *loader_local;
  Functions *dst_local;
  ApiType apiType_local;
  
  local_20 = loader;
  loader_local = (FunctionLoader *)dst;
  dst_local._4_4_ = apiType.m_bits;
  if (initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)::s_initFuncs ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)
                                 ::s_initFuncs);
    if (iVar2 != 0) {
      initCoreFunctions::s_initFuncs[0].apiType = ApiType::es(2,0);
      initCoreFunctions::s_initFuncs[0].initFunc = glw::initES20;
      initCoreFunctions::s_initFuncs[1].apiType = ApiType::es(3,0);
      initCoreFunctions::s_initFuncs[1].initFunc = glw::initES30;
      initCoreFunctions::s_initFuncs[2].apiType = ApiType::es(3,1);
      initCoreFunctions::s_initFuncs[2].initFunc = glw::initES31;
      initCoreFunctions::s_initFuncs[3].apiType = ApiType::es(3,2);
      initCoreFunctions::s_initFuncs[3].initFunc = glw::initES32;
      initCoreFunctions::s_initFuncs[4].apiType = ApiType::core(3,0);
      initCoreFunctions::s_initFuncs[4].initFunc = glw::initGL30Core;
      initCoreFunctions::s_initFuncs[5].apiType = ApiType::core(3,1);
      initCoreFunctions::s_initFuncs[5].initFunc = glw::initGL31Core;
      initCoreFunctions::s_initFuncs[6].apiType = ApiType::core(3,2);
      initCoreFunctions::s_initFuncs[6].initFunc = glw::initGL32Core;
      initCoreFunctions::s_initFuncs[7].apiType = ApiType::core(3,3);
      initCoreFunctions::s_initFuncs[7].initFunc = glw::initGL33Core;
      initCoreFunctions::s_initFuncs[8].apiType = ApiType::core(4,0);
      initCoreFunctions::s_initFuncs[8].initFunc = glw::initGL40Core;
      initCoreFunctions::s_initFuncs[9].apiType = ApiType::core(4,1);
      initCoreFunctions::s_initFuncs[9].initFunc = glw::initGL41Core;
      initCoreFunctions::s_initFuncs[10].apiType = ApiType::core(4,2);
      initCoreFunctions::s_initFuncs[10].initFunc = glw::initGL42Core;
      initCoreFunctions::s_initFuncs[0xb].apiType = ApiType::core(4,3);
      initCoreFunctions::s_initFuncs[0xb].initFunc = glw::initGL43Core;
      initCoreFunctions::s_initFuncs[0xc].apiType = ApiType::core(4,4);
      initCoreFunctions::s_initFuncs[0xc].initFunc = glw::initGL44Core;
      initCoreFunctions::s_initFuncs[0xd].apiType = ApiType::core(4,5);
      initCoreFunctions::s_initFuncs[0xd].initFunc = glw::initGL45Core;
      __cxa_guard_release(&initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)
                           ::s_initFuncs);
    }
  }
  local_30 = 0;
  while( true ) {
    if (0xd < local_30) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Don\'t know how to load functions for ",&local_79);
      de::toString<glu::ApiType>(&local_a0,(ApiType *)((long)&dst_local + 4));
      std::operator+(&local_58,&local_78,&local_a0);
      tcu::InternalError::InternalError(this,&local_58);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    local_34 = dst_local._4_4_;
    bVar1 = ApiType::operator==(&initCoreFunctions::s_initFuncs[local_30].apiType,dst_local._4_4_);
    if (bVar1) break;
    local_30 = local_30 + 1;
  }
  (*initCoreFunctions::s_initFuncs[local_30].initFunc)((Functions *)loader_local,local_20);
  return;
}

Assistant:

void initCoreFunctions (glw::Functions* dst, const glw::FunctionLoader* loader, ApiType apiType)
{
	static const struct
	{
		ApiType		apiType;
		void		(*initFunc)		(glw::Functions* gl, const glw::FunctionLoader* loader);
	} s_initFuncs[] =
	{
		{ ApiType::es(2,0),		glw::initES20		},
		{ ApiType::es(3,0),		glw::initES30		},
		{ ApiType::es(3,1),		glw::initES31		},
		{ ApiType::es(3,2),		glw::initES32		},
		{ ApiType::core(3,0),	glw::initGL30Core	},
		{ ApiType::core(3,1),	glw::initGL31Core	},
		{ ApiType::core(3,2),	glw::initGL32Core	},
		{ ApiType::core(3,3),	glw::initGL33Core	},
		{ ApiType::core(4,0),	glw::initGL40Core	},
		{ ApiType::core(4,1),	glw::initGL41Core	},
		{ ApiType::core(4,2),	glw::initGL42Core	},
		{ ApiType::core(4,3),	glw::initGL43Core	},
		{ ApiType::core(4,4),	glw::initGL44Core	},
		{ ApiType::core(4,5),	glw::initGL45Core	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_initFuncs); ndx++)
	{
		if (s_initFuncs[ndx].apiType == apiType)
		{
			s_initFuncs[ndx].initFunc(dst, loader);
			return;
		}
	}

	throw tcu::InternalError(std::string("Don't know how to load functions for ") + de::toString(apiType));
}